

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsignalspy.cpp
# Opt level: O1

void __thiscall QSignalSpy::appendArgs(QSignalSpy *this,void **a)

{
  QMutex *pQVar1;
  __pointer_type pQVar2;
  int iVar3;
  QEventLoop *pQVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QMetaType local_80;
  QArrayDataPointer<QVariant> local_78;
  undefined1 local_58 [16];
  QMetaTypeInterface *local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = (Data *)0x0;
  local_78.ptr = (QVariant *)0x0;
  local_78.size = 0;
  QList<QVariant>::reserve((QList<QVariant> *)&local_78,(this->args).d.size);
  if ((this->args).d.size != 0) {
    uVar7 = 0;
    do {
      iVar3 = (this->args).d.ptr[uVar7];
      if (iVar3 == 0x29) {
        QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant_const&>
                  ((QMovableArrayOps<QVariant> *)&local_78,local_78.size,(QVariant *)a[uVar7 + 1]);
        QList<QVariant>::end((QList<QVariant> *)&local_78);
      }
      else {
        QMetaType::QMetaType(&local_80,iVar3);
        QVariant::QVariant((QVariant *)local_58,local_80,a[uVar7 + 1]);
        QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
                  ((QMovableArrayOps<QVariant> *)&local_78,local_78.size,(QVariant *)local_58);
        QList<QVariant>::end((QList<QVariant> *)&local_78);
        QVariant::~QVariant((QVariant *)local_58);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(this->args).d.size);
  }
  pQVar1 = &this->m_mutex;
  if ((this->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar8 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar8) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar8) goto LAB_001242f0;
  }
  QBasicMutex::lockInternal();
LAB_001242f0:
  QtPrivate::QMovableArrayOps<QList<QVariant>>::emplace<QList<QVariant>>
            ((QMovableArrayOps<QList<QVariant>> *)this,(this->super_QList<QList<QVariant>_>).d.size,
             (QList<QVariant> *)&local_78);
  QList<QList<QVariant>_>::end(&this->super_QList<QList<QVariant>_>);
  if (this->m_waiting == true) {
    LOCK();
    pQVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
    (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pQVar2 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(pQVar1);
    }
    lVar5 = QObject::thread();
    lVar6 = QThread::currentThread();
    if (lVar5 == lVar6) {
      QBasicTimer::stop();
      pQVar4 = (this->m_loop).loop;
      if (pQVar4 != (QEventLoop *)0x0) {
        QEventLoop::exit((int)pQVar4);
      }
    }
    else {
      local_58._0_8_ = (PrivateShared *)0x0;
      local_58._8_8_ = 0;
      local_48[0] = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                (&(this->m_loop).super_QObject,"exitLoop",QueuedConnection,1,(void **)local_58,
                 (char **)(local_58 + 8),local_48);
    }
  }
  else {
    LOCK();
    pQVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
    (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (pQVar2 != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex(pQVar1);
    }
  }
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSignalSpy::appendArgs(void **a)
{
    QList<QVariant> list;
    list.reserve(args.size());
    for (qsizetype i = 0; i < args.size(); ++i) {
        const QMetaType::Type type = static_cast<QMetaType::Type>(args.at(i));
        if (type == QMetaType::QVariant)
            list << *reinterpret_cast<QVariant *>(a[i + 1]);
        else
            list << QVariant(QMetaType(type), a[i + 1]);
    }
    QMutexLocker locker(&m_mutex);
    append(std::move(list));

    if (m_waiting) {
        locker.unlock();
        m_loop.exitLoop();
    }
}